

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

bool TestConstExpr::EqualTest<short,unsigned_long_long>(void)

{
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_32;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_30;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_2e;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_2c;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_2a;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_28;
  int local_20 [6];
  
  local_20[5] = 3;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
            (&local_2a,local_20 + 5);
  if (local_2a.m_int == 2) {
    local_20[4] = 4;
    SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
              (&local_2c,local_20 + 4);
    if (local_2c.m_int == 5) {
      local_20[3] = 6;
      SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                (&local_2e,local_20 + 3);
      local_20[2] = 7;
      SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::
      SafeInt<int>(&local_28,local_20 + 2);
      if ((long)local_2e.m_int < 0) {
        return false;
      }
      if (local_28.m_int != (long)local_2e.m_int) {
        return false;
      }
      local_20[1] = 1;
      SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                (&local_30,local_20 + 1);
      if (local_30.m_int != 0) {
        local_20[0] = 0;
        SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                  (&local_32,local_20);
        return local_32.m_int == 0;
      }
    }
  }
  return false;
}

Assistant:

SAFEINT_CONSTEXPR11 bool EqualTest()
	{
		return
			(U)2 == SafeInt<T>(3) &&
			SafeInt<T>(4) == (U)5 &&
			SafeInt<T>(6) == SafeInt<U>(7) &&
			true == SafeInt<T>(1) &&
			false == SafeInt<T>(0);
	}